

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1692::~TestCase1692(TestCase1692 *this)

{
  TestCase1692 *this_local;
  
  kj::TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

TEST(Encoding, Embeds) {
  {
    kj::ArrayInputStream input(test::EMBEDDED_DATA);
    PackedMessageReader reader(input);
    checkTestMessage(reader.getRoot<TestAllTypes>());
  }

#if !CAPNP_LITE

  {
    MallocMessageBuilder builder;
    auto root = builder.getRoot<TestAllTypes>();
    initTestMessage(root);
    kj::StringPtr text = test::EMBEDDED_TEXT;
    EXPECT_EQ(kj::str(root, text.endsWith("\r\n") ? "\r\n" : "\n"), text);
  }

#endif // CAPNP_LITE

  {
    checkTestMessage(test::EMBEDDED_STRUCT);
  }
}